

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O2

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::translate_atom_escape
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,state_type *atom,uchar21 **curpos,
          uchar21 *end,re_compiler_state<char> *cstate)

{
  uchar21 uVar1;
  bool bVar2;
  uchar21 *puVar3;
  
  puVar3 = *curpos;
  if (puVar3 == end) {
    re_object_core<char,_srell::u8regex_traits<char>_>::throw_error
              (&this->super_re_object_core<char,_srell::u8regex_traits<char>_>,
               &regex_constants::error_escape);
    puVar3 = *curpos;
  }
  uVar1 = *puVar3;
  (atom->field_0).character = uVar1;
  if (uVar1 == L'k') {
    bVar2 = parse_backreference_name(this,atom,curpos,end,cstate);
    return bVar2;
  }
  if (uVar1 != L'B') {
    if (uVar1 == L'b') goto LAB_001a41a8;
    if (uVar1 != L'-') {
      if ((uint)(uVar1 + L'\xffffffcf') < 9) {
        bVar2 = parse_backreference_number(this,atom,curpos,end,cstate);
        return bVar2;
      }
      bVar2 = translate_escseq(this,atom,curpos,end);
      if (!bVar2) {
        return false;
      }
      bVar2 = register_if_negatedcharclass(this,atom);
      return bVar2;
    }
    re_object_core<char,_srell::u8regex_traits<char>_>::throw_error
              (&this->super_re_object_core<char,_srell::u8regex_traits<char>_>,
               &regex_constants::error_escape);
  }
  (atom->field_5).is_not = true;
LAB_001a41a8:
  atom->type = st_boundary;
  (atom->quantifier).field_0 = (anon_union_4_2_5ef4d77c_for_re_quantifier_1)0x0;
  (atom->quantifier).field_1 = (anon_union_4_2_b9ef3311_for_re_quantifier_3)0x0;
  (atom->quantifier).field_2.is_greedy = true;
  if (((this->super_re_object_core<char,_srell::u8regex_traits<char>_>).soflags & icase) == 0) {
    uVar1 = L'\x04';
  }
  else {
    re_character_class::setup_icase_word
              (&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class);
    uVar1 = L'\x05';
  }
  (atom->field_0).character = uVar1;
  *curpos = *curpos + 1;
  return true;
}

Assistant:

bool translate_atom_escape(state_type &atom, const uchar21 *&curpos, const uchar21 *const end, /* const */ re_compiler_state<charT> &cstate)
	{
		if (curpos == end)
			this->throw_error(regex_constants::error_escape);

		atom.character = *curpos;

		switch (atom.character)
		{
		case meta_char::mc_minus:	//  '-'
			this->throw_error(regex_constants::error_escape);
			//@fallthrough@

		case char_alnum::ch_B:	//  'B':
			atom.is_not = true;
			//@fallthrough@

		case char_alnum::ch_b:	//  'b':
			atom.type   = st_boundary;	//  \b, \B.
			atom.quantifier.reset(0);
//			atom.number = 0;
			if (this->is_icase())
			{
				this->character_class.setup_icase_word();
				atom.number = static_cast<unsigned int>(re_character_class::icase_word);
			}
			else
				atom.number = static_cast<unsigned int>(re_character_class::word);	//  \w, \W.
			break;

//		case char_alnum::ch_A:	//  'A':
//			atom.type   = st_bol;	//  '\A'
//		case char_alnum::ch_Z:	//  'Z':
//			atom.type   = st_eol;	//  '\Z'
//		case char_alnum::ch_z:	//  'z':
//			atom.type   = st_eol;	//  '\z'

		//  Backreferences.

#if !defined(SRELL_NO_NAMEDCAPTURE)
		//  Prepared for named captures.
		case char_alnum::ch_k:	//  'k':
			return parse_backreference_name(atom, curpos, end, cstate);	//  \k.
#endif

		default:

			if (atom.character >= char_alnum::ch_1 && atom.character <= char_alnum::ch_9)	//  \1, \9.
				return parse_backreference_number(atom, curpos, end, cstate);

			return translate_escseq(atom, curpos, end) && register_if_negatedcharclass(atom);
		}

		++curpos;
		return true;
	}